

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

void __thiscall Centaurus::ATNPath::parse(ATNPath *this,Stream *stream)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *pwVar3;
  StreamException *pSVar4;
  wchar_t __wc;
  int index;
  wstring index_str;
  Identifier id;
  
  while( true ) {
    Identifier::Identifier(&id,stream);
    wVar1 = Stream::get(stream);
    if (wVar1 != L'.') {
      pSVar4 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar4,stream,wVar1);
      __cxa_throw(pSVar4,&StreamException::typeinfo,StreamException::~StreamException);
    }
    index_str._M_dataplus._M_p = (pointer)&index_str.field_2;
    index_str._M_string_length = 0;
    index_str.field_2._M_local_buf[0] = L'\0';
    wVar1 = Stream::get(stream);
    iVar2 = iswdigit(wVar1);
    if (iVar2 == 0) break;
    wVar1 = (wchar_t)&index_str;
    std::__cxx11::wstring::push_back(wVar1);
    pwVar3 = (stream->m_cur)._M_current;
    if (pwVar3 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length)
    goto LAB_00140088;
    __wc = L'\0';
    while( true ) {
      iVar2 = iswdigit(__wc);
      if (iVar2 == 0) break;
      std::__cxx11::wstring::push_back(wVar1);
      Stream::get(stream);
      pwVar3 = (stream->m_cur)._M_current;
      __wc = L'\0';
      if (pwVar3 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
LAB_00140088:
        __wc = *pwVar3;
      }
    }
    index = std::__cxx11::stoi(&index_str,(size_t *)0x0,10);
    std::
    vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>
    ::emplace_back<Centaurus::Identifier&,int&>
              ((vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>
                *)&this->
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ,&id,&index);
    wVar1 = Stream::get(stream);
    if (wVar1 != L'/') {
      if (wVar1 == L'\0') {
        std::__cxx11::wstring::~wstring((wstring *)&index_str);
        Identifier::~Identifier(&id);
        return;
      }
      pSVar4 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar4,stream,wVar1);
      __cxa_throw(pSVar4,&StreamException::typeinfo,StreamException::~StreamException);
    }
    std::__cxx11::wstring::~wstring((wstring *)&index_str);
    Identifier::~Identifier(&id);
  }
  pSVar4 = (StreamException *)__cxa_allocate_exception(0x28);
  Stream::unexpected(pSVar4,stream,wVar1);
  __cxa_throw(pSVar4,&StreamException::typeinfo,StreamException::~StreamException);
}

Assistant:

void ATNPath::parse(Stream& stream)
{
    while (true)
    {
        Identifier id(stream);

        wchar_t ch = stream.get();
        if (ch != L'.')
            throw stream.unexpected(ch);

        std::wstring index_str;
        ch = stream.get();
        if (!iswdigit(ch))
            throw stream.unexpected(ch);

        index_str.push_back(ch);

        for (ch = stream.peek(); iswdigit(ch); ch = stream.peek())
        {
            index_str.push_back(ch);
            stream.discard();
        }

        int index = std::stoi(index_str);

        emplace_back(id, index);

        ch = stream.get();
        if (ch == L'\0')
            break;
        else if (ch != L'/')
            throw stream.unexpected(ch);
    }
}